

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O1

socket_handle __thiscall
FIX::SocketServer::add
          (SocketServer *this,int port,bool reuse,bool noDelay,int sendBufSize,int rcvBufSize)

{
  _Rb_tree_header *p_Var1;
  socket_handle sVar2;
  short sVar3;
  int iVar4;
  mapped_type *pmVar5;
  SocketException *this_00;
  undefined7 in_register_00000009;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  socket_handle socket;
  mapped_type local_40;
  
  p_Var1 = &(this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->m_portToInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < port]) {
    if (port <= (int)p_Var7[1]._M_color) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var7 = p_Var6, port < (int)p_Var6[1]._M_color)) {
    p_Var7 = &p_Var1->_M_header;
  }
  local_40._4_4_ = port;
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    local_40.m_socket = socket_createAcceptor(port,reuse);
    if (local_40.m_socket == -1) {
      this_00 = (SocketException *)__cxa_allocate_exception(0x50);
      SocketException::SocketException(this_00);
      __cxa_throw(this_00,&SocketException::typeinfo,FIX::Exception::~Exception);
    }
    if (noDelay) {
      socket_setsockopt(local_40.m_socket,1);
    }
    if (sendBufSize != 0) {
      socket_setsockopt(local_40.m_socket,7,sendBufSize);
    }
    local_40.m_sendBufSize = (int)CONCAT71(in_register_00000009,noDelay);
    local_40.m_rcvBufSize = sendBufSize;
    if (rcvBufSize != 0) {
      socket_setsockopt(local_40.m_socket,8,rcvBufSize);
    }
    SocketMonitor::addRead(&this->m_monitor,local_40.m_socket);
    sVar2 = local_40.m_socket;
    sVar3 = local_40.m_port;
    pmVar5 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](&this->m_socketToInfo,&local_40.m_socket);
    iVar4 = local_40.m_rcvBufSize;
    pmVar5->m_socket = sVar2;
    pmVar5->m_port = sVar3;
    bVar8 = SUB41(local_40.m_sendBufSize,0);
    pmVar5->m_noDelay = bVar8;
    pmVar5->m_sendBufSize = local_40.m_rcvBufSize;
    pmVar5->m_rcvBufSize = rcvBufSize;
    pmVar5 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](&this->m_portToInfo,(key_type *)&local_40.m_port);
    pmVar5->m_socket = sVar2;
    pmVar5->m_port = sVar3;
    pmVar5->m_noDelay = bVar8;
    pmVar5->m_sendBufSize = iVar4;
    pmVar5->m_rcvBufSize = rcvBufSize;
    pmVar5 = &local_40;
  }
  else {
    pmVar5 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](&this->m_portToInfo,(key_type *)&local_40.m_port);
  }
  return pmVar5->m_socket;
}

Assistant:

socket_handle SocketServer::add( int port, bool reuse, bool noDelay,
                       int sendBufSize, int rcvBufSize )
  EXCEPT ( SocketException& )
{
  if( m_portToInfo.find(port) != m_portToInfo.end() )
    return m_portToInfo[port].m_socket;

  socket_handle socket = socket_createAcceptor( port, reuse );
  if( socket == INVALID_SOCKET_HANDLE)
    throw SocketException();
  if( noDelay )
    socket_setsockopt( socket, TCP_NODELAY );
  if( sendBufSize )
    socket_setsockopt( socket, SO_SNDBUF, sendBufSize );
  if( rcvBufSize )
    socket_setsockopt( socket, SO_RCVBUF, rcvBufSize );
  m_monitor.addRead( socket );

  SocketInfo info( socket, port, noDelay, sendBufSize, rcvBufSize );
  m_socketToInfo[socket] = info;
  m_portToInfo[port] = info;
  return socket;
}